

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementCableANCF.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementCableANCF::EvaluateSectionFrame
          (ChElementCableANCF *this,double eta,ChVector<double> *point,ChQuaternion<double> *rot)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  pointer psVar11;
  element_type *peVar12;
  element_type *peVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  double dVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  double dVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  double dVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  double dVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  undefined1 auVar75 [16];
  ShapeVector N;
  ulong local_c0;
  ulong local_b0;
  ulong local_a0;
  ulong local_80;
  double local_78;
  ulong local_70;
  ulong local_68;
  
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[0x1b]
  )(this,&local_80);
  psVar11 = (this->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  auVar43._8_8_ = local_80;
  auVar43._0_8_ = local_80;
  peVar12 = (psVar11->super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
  peVar13 = psVar11[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  dVar53 = *(double *)&(peVar12->super_ChNodeFEAxyz).field_0xf0;
  auVar25 = *(undefined1 (*) [16])&(peVar12->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x20;
  dVar58 = *(double *)&peVar12->field_0x100;
  uVar1 = *(ulong *)&(peVar12->super_ChNodeFEAxyz).field_0x30;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar1;
  auVar51 = *(undefined1 (*) [16])&(peVar13->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x20;
  uVar2 = *(ulong *)&(peVar13->super_ChNodeFEAxyz).field_0x30;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar2;
  uVar3 = *(ulong *)&peVar13->field_0x100;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar3;
  auVar62 = *(undefined1 (*) [16])&(peVar13->super_ChNodeFEAxyz).field_0xf0;
  dVar26 = *(double *)&peVar12->field_0xf8;
  uVar4 = *(ulong *)&(peVar12->super_ChNodeFEAxyz).field_0x28;
  auVar39._0_8_ = dVar53 * local_78;
  auVar39._8_8_ = *(double *)&peVar12->field_0xf8 * local_78;
  uVar5 = *(ulong *)&(peVar13->super_ChNodeFEAxyz).field_0x28;
  uVar6 = *(ulong *)&peVar13->field_0xf8;
  auVar14 = vfmadd231pd_fma(auVar39,auVar43,auVar25);
  auVar48._8_8_ = local_70;
  auVar48._0_8_ = local_70;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar58 * local_78;
  auVar15 = vfmadd231sd_fma(auVar28,auVar65,auVar43);
  auVar14 = vfmadd231pd_fma(auVar14,auVar48,auVar51);
  auVar54._8_8_ = local_68;
  auVar54._0_8_ = local_68;
  auVar15 = vfmadd231sd_fma(auVar15,auVar69,auVar48);
  auVar14 = vfmadd231pd_fma(auVar14,auVar54,auVar62);
  auVar15 = vfmadd231sd_fma(auVar15,auVar59,auVar54);
  *(undefined1 (*) [16])point->m_data = auVar14;
  point->m_data[2] = auVar15._0_8_;
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[0x1c]
  )((eta + 1.0) * 0.5,this,&local_80);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_80;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = local_70;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = local_68;
  auVar24 = ZEXT816(0x3ff0000000000000);
  auVar23 = ZEXT816(0) << 0x40;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar4;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = local_78 * dVar26;
  auVar14 = vfmadd231sd_fma(auVar60,auVar29,auVar14);
  local_c0 = auVar25._0_8_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_c0;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = local_78 * dVar53;
  auVar25 = vfmadd231sd_fma(auVar44,auVar29,auVar25);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar1;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = local_78 * dVar58;
  auVar15 = vfmadd231sd_fma(auVar66,auVar29,auVar15);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar5;
  auVar14 = vfmadd231sd_fma(auVar14,auVar49,auVar7);
  local_b0 = auVar51._0_8_;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = local_b0;
  auVar25 = vfmadd231sd_fma(auVar25,auVar49,auVar51);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar2;
  auVar51 = vfmadd231sd_fma(auVar15,auVar49,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar6;
  auVar14 = vfmadd231sd_fma(auVar14,auVar55,auVar9);
  local_a0 = auVar62._0_8_;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = local_a0;
  auVar62 = vfmadd231sd_fma(auVar25,auVar55,auVar62);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar3;
  auVar51 = vfmadd231sd_fma(auVar51,auVar55,auVar10);
  dVar58 = auVar14._0_8_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar58 * dVar58;
  auVar25 = vfmadd231sd_fma(auVar30,auVar62,auVar62);
  auVar25 = vfmadd231sd_fma(auVar25,auVar51,auVar51);
  auVar25 = vsqrtsd_avx(auVar25,auVar25);
  dVar26 = 1.0 / auVar25._0_8_;
  bVar19 = 2.2250738585072014e-308 <= auVar25._0_8_;
  auVar20._0_8_ =
       (double)((ulong)bVar19 * (long)(auVar62._0_8_ * dVar26) + (ulong)!bVar19 * 0x3ff0000000000000
               );
  auVar20._8_8_ = 0;
  dVar58 = (double)((ulong)bVar19 * (long)(dVar58 * dVar26));
  dVar26 = (double)((ulong)bVar19 * (long)(auVar51._0_8_ * dVar26));
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar26;
  if ((((auVar20._0_8_ != 0.0) || (NAN(auVar20._0_8_))) || (dVar58 != 0.0)) || (NAN(dVar58))) {
LAB_006924d5:
    auVar56._8_8_ = 0;
    auVar56._0_8_ = dVar58 * dVar58;
    auVar25 = vfmadd231sd_fma(auVar56,auVar20,auVar20);
    auVar25 = vfmadd231sd_fma(auVar25,auVar21,auVar21);
    auVar25 = vsqrtsd_avx(auVar25,auVar25);
    dVar53 = 1.0 / auVar25._0_8_;
    bVar19 = 2.2250738585072014e-308 <= auVar25._0_8_;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = (ulong)bVar19 * (long)(dVar26 * dVar53);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = (ulong)bVar19 * (long)(dVar58 * dVar53);
    auVar24._0_8_ =
         (ulong)bVar19 * (long)(auVar20._0_8_ * dVar53) + (ulong)!bVar19 * 0x3ff0000000000000;
    auVar24._8_8_ = 0;
  }
  else {
    auVar22 = ZEXT816(0) << 0x40;
    if ((dVar26 != 0.0) || (NAN(dVar26))) goto LAB_006924d5;
  }
  dVar73 = auVar22._0_8_;
  dVar72 = auVar23._0_8_;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = DAT_00b689d8;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = VECT_Y;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = DAT_00b689d0;
  dVar71 = auVar24._0_8_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar71 * DAT_00b689d8;
  auVar25 = vfmsub231sd_fma(auVar45,auVar22,auVar61);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar73 * DAT_00b689d0;
  auVar51 = vfmsub231sd_fma(auVar40,auVar23,auVar50);
  dVar58 = auVar51._0_8_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar72 * VECT_Y;
  auVar62 = vfmsub231sd_fma(auVar31,auVar24,auVar57);
  dVar26 = auVar62._0_8_;
  dVar53 = auVar25._0_8_;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar53 * dVar53;
  auVar25 = vfmadd231sd_fma(auVar67,auVar51,auVar51);
  auVar25 = vfmadd231sd_fma(auVar25,auVar62,auVar62);
  auVar25 = vsqrtsd_avx(auVar25,auVar25);
  dVar47 = auVar25._0_8_;
  if (dVar47 < 0.0001) {
    auVar16._8_8_ = 0x7fffffffffffffff;
    auVar16._0_8_ = 0x7fffffffffffffff;
    auVar25 = vandpd_avx512vl(auVar61,auVar16);
    if (0.9 <= auVar25._0_8_) {
      auVar17._8_8_ = 0x7fffffffffffffff;
      auVar17._0_8_ = 0x7fffffffffffffff;
      auVar25 = vandpd_avx512vl(auVar57,auVar17);
      if (0.9 <= auVar25._0_8_) {
        auVar18._8_8_ = 0x7fffffffffffffff;
        auVar18._0_8_ = 0x7fffffffffffffff;
        auVar25 = vandpd_avx512vl(auVar50,auVar18);
        auVar51 = ZEXT816(0);
        if (0.9 <= auVar25._0_8_) goto LAB_006925e6;
        auVar25 = ZEXT816(0x3ff0000000000000);
      }
      else {
        auVar51 = ZEXT816(0x3ff0000000000000);
LAB_006925e6:
        auVar25 = ZEXT816(0);
      }
      auVar62 = ZEXT816(0);
    }
    else {
      auVar62 = ZEXT816(0x3ff0000000000000);
      auVar25 = ZEXT816(0);
      auVar51 = ZEXT816(0);
    }
    auVar46._8_8_ = 0;
    auVar46._0_8_ = auVar25._0_8_ * -dVar71;
    auVar14 = vfmadd231sd_fma(auVar46,auVar22,auVar62);
    auVar41._8_8_ = 0;
    auVar41._0_8_ = auVar51._0_8_ * -dVar73;
    auVar25 = vfmadd231sd_fma(auVar41,auVar23,auVar25);
    dVar58 = auVar25._0_8_;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = auVar62._0_8_ * -dVar72;
    auVar51 = vfmadd231sd_fma(auVar32,auVar24,auVar51);
    dVar26 = auVar51._0_8_;
    dVar53 = auVar14._0_8_;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = dVar53 * dVar53;
    auVar25 = vfmadd231sd_fma(auVar52,auVar25,auVar25);
    auVar25 = vfmadd231sd_fma(auVar25,auVar51,auVar51);
    auVar25 = vsqrtsd_avx(auVar25,auVar25);
    dVar47 = auVar25._0_8_;
  }
  dVar47 = 1.0 / dVar47;
  dVar58 = dVar58 * dVar47;
  dVar26 = dVar26 * dVar47;
  dVar53 = dVar53 * dVar47;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar26;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar73 * dVar58;
  auVar25 = vfmsub231sd_fma(auVar42,auVar33,auVar24);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = dVar72 * dVar26;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = dVar53;
  auVar51 = vfmsub231sd_fma(auVar68,auVar70,auVar22);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar58;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = dVar71 * dVar53;
  auVar62 = vfmsub231sd_fma(auVar75,auVar63,auVar23);
  dVar38 = auVar25._0_8_;
  dVar47 = dVar26 + dVar71 + dVar38;
  dVar64 = auVar51._0_8_;
  dVar74 = auVar62._0_8_;
  if (0.0 <= dVar47) {
    dVar47 = dVar47 + 1.0;
    if (dVar47 < 0.0) {
      dVar26 = sqrt(dVar47);
    }
    else {
      auVar35._8_8_ = 0;
      auVar35._0_8_ = dVar47;
      auVar25 = vsqrtsd_avx(auVar35,auVar35);
      dVar26 = auVar25._0_8_;
    }
    dVar38 = dVar26 * 0.5;
    dVar26 = 0.5 / dVar26;
    dVar47 = (dVar74 - dVar53) * dVar26;
    dVar71 = (dVar58 - dVar73) * dVar26;
    dVar26 = (dVar72 - dVar64) * dVar26;
    goto LAB_006928d5;
  }
  if (dVar38 <= dVar71) {
    if (dVar71 < dVar26) goto LAB_006926b4;
    dVar26 = ((dVar71 - dVar38) - dVar26) + 1.0;
    if (dVar26 < 0.0) {
      dVar27 = sqrt(dVar26);
    }
    else {
      auVar37._8_8_ = 0;
      auVar37._0_8_ = dVar26;
      auVar25 = vsqrtsd_avx(auVar37,auVar37);
      dVar27 = auVar25._0_8_;
    }
    dVar38 = dVar74 - dVar53;
    dVar47 = dVar27 * 0.5;
    dVar27 = 0.5 / dVar27;
    dVar71 = (dVar72 + dVar64) * dVar27;
    dVar26 = (dVar73 + dVar58) * dVar27;
  }
  else if (dVar38 < dVar26) {
LAB_006926b4:
    dVar26 = ((dVar26 - dVar71) - dVar38) + 1.0;
    if (dVar26 < 0.0) {
      dVar27 = sqrt(dVar26);
    }
    else {
      auVar36._8_8_ = 0;
      auVar36._0_8_ = dVar26;
      auVar25 = vsqrtsd_avx(auVar36,auVar36);
      dVar27 = auVar25._0_8_;
    }
    dVar38 = dVar72 - dVar64;
    dVar26 = dVar27 * 0.5;
    dVar27 = 0.5 / dVar27;
    dVar47 = (dVar73 + dVar58) * dVar27;
    dVar71 = (dVar74 + dVar53) * dVar27;
  }
  else {
    dVar26 = ((dVar38 - dVar26) - dVar71) + 1.0;
    if (dVar26 < 0.0) {
      dVar27 = sqrt(dVar26);
    }
    else {
      auVar34._8_8_ = 0;
      auVar34._0_8_ = dVar26;
      auVar25 = vsqrtsd_avx(auVar34,auVar34);
      dVar27 = auVar25._0_8_;
    }
    dVar38 = dVar58 - dVar73;
    dVar71 = dVar27 * 0.5;
    dVar27 = 0.5 / dVar27;
    dVar26 = (dVar74 + dVar53) * dVar27;
    dVar47 = (dVar72 + dVar64) * dVar27;
  }
  dVar38 = dVar38 * dVar27;
LAB_006928d5:
  rot->m_data[0] = dVar38;
  rot->m_data[1] = dVar47;
  rot->m_data[2] = dVar71;
  rot->m_data[3] = dVar26;
  return;
}

Assistant:

void ChElementCableANCF::EvaluateSectionFrame(const double eta, ChVector<>& point, ChQuaternion<>& rot) {
    ChVector<> u_displ;
    ChVector<> u_rotaz;

    double xi = (eta + 1.0) * 0.5;  // because ShapeFunctions() works in 0..1 range
    ShapeVector N;
    ShapeFunctions(N, xi);

    ChVector<> pA = this->nodes[0]->GetPos();
    ChVector<> dA = this->nodes[0]->GetD();
    ChVector<> pB = this->nodes[1]->GetPos();
    ChVector<> dB = this->nodes[1]->GetD();

    point.x() = N(0) * pA.x() + N(1) * dA.x() + N(2) * pB.x() + N(3) * dB.x();
    point.y() = N(0) * pA.y() + N(1) * dA.y() + N(2) * pB.y() + N(3) * dB.y();
    point.z() = N(0) * pA.z() + N(1) * dA.z() + N(2) * pB.z() + N(3) * dB.z();

    this->ShapeFunctionsDerivatives(N, xi);

    ChVector<> Dx;

    Dx.x() = N(0) * pA.x() + N(1) * dA.x() + N(2) * pB.x() + N(3) * dB.x();
    Dx.y() = N(0) * pA.y() + N(1) * dA.y() + N(2) * pB.y() + N(3) * dB.y();
    Dx.z() = N(0) * pA.z() + N(1) * dA.z() + N(2) * pB.z() + N(3) * dB.z();

    // This element has no torsional dof, so once we have the Dx direction
    // of the line, we must compute the Dy and Dz directions by using a
    // Gram-Schmidt orthonormalization , where we propose a guess direction
    // VECT_Y for the vertical:
    ChMatrix33<> msect;
    Dx.Normalize();
    msect.Set_A_Xdir(Dx, VECT_Y);

    rot = msect.Get_A_quaternion();
}